

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_basic.c
# Opt level: O1

void verify_sparse_file(archive *a,char *path,sparse *sparse,int expected_holes)

{
  ulong uVar1;
  anon_enum_32 aVar2;
  bool bVar3;
  archive *extra;
  wchar_t wVar4;
  int iVar5;
  archive_entry *paVar6;
  la_int64_t lVar7;
  void *_v1;
  void *pvVar8;
  size_t sVar9;
  long v1;
  long lVar10;
  char cVar11;
  char *pcVar12;
  int64_t offset;
  int local_74;
  void *buff;
  size_t bytes_read;
  void *local_60;
  uint local_54;
  archive *local_50;
  char *local_48;
  archive_entry *local_40;
  size_t *local_38;
  
  local_54 = expected_holes;
  create_sparse_file(path,sparse);
  paVar6 = archive_entry_new();
  lVar10 = 0;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'œ',(uint)(paVar6 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  local_48 = path;
  wVar4 = archive_read_disk_open(a,path);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'Ŕ',0,"ARCHIVE_OK",(long)wVar4,"archive_read_disk_open(a, path)",a);
  local_40 = paVar6;
  iVar5 = archive_read_next_header2(a,paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'ŕ',0,"ARCHIVE_OK",(long)iVar5,"archive_read_next_header2(a, ae)",a);
  local_50 = a;
  iVar5 = archive_read_data_block(a,&buff,&bytes_read,&offset);
  if (iVar5 == 0) {
    v1 = 0;
    local_74 = 0;
    lVar10 = 0;
    do {
      bVar3 = lVar10 < offset;
      sVar9 = sparse->size;
      lVar10 = sVar9 + v1;
      _v1 = buff;
      if (lVar10 < offset) {
        local_60 = buff;
        do {
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                           ,L'Ũ',(uint)(sparse->type == HOLE),"sparse->type == HOLE",(void *)0x0);
          v1 = v1 + sparse->size;
          sVar9 = sparse[1].size;
          sparse = sparse + 1;
          lVar10 = sVar9 + v1;
          _v1 = local_60;
        } while (lVar10 < offset);
      }
      if ((v1 < offset) && (lVar10 <= (long)(offset + bytes_read))) {
        pvVar8 = (void *)((long)buff + sVar9 + (v1 - offset));
        local_38 = &sparse->size;
        if (sparse->type == HOLE) {
          wVar4 = L'Ŵ';
          pcVar12 = "\'\\0\'";
          cVar11 = '\0';
LAB_001c54ce:
          assertion_memory_filled_with
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                     ,wVar4,_v1,"start",(long)pvVar8 - (long)_v1,"end - start",cVar11,pcVar12,
                     (void *)0x0);
        }
        else {
          local_60 = _v1;
          wVar4 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                                   ,L'ŵ',(uint)(sparse->type == DATA),"sparse->type == DATA",
                                   (void *)0x0);
          if (wVar4 != L'\0') {
            wVar4 = L'Ŷ';
            pcVar12 = "\' \'";
            cVar11 = ' ';
            _v1 = local_60;
            goto LAB_001c54ce;
          }
        }
        v1 = v1 + *local_38;
        sparse = sparse + 1;
        _v1 = pvVar8;
      }
      local_74 = local_74 + (uint)bVar3;
      do {
        uVar1 = sparse->size + v1;
        if ((long)(bytes_read + offset) < (long)uVar1) break;
        pvVar8 = (void *)((long)buff + (v1 - offset) + sparse->size);
        if (sparse->type == DATA) {
          wVar4 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                                   ,L'Ƒ',(uint)(uVar1 <= bytes_read + offset),
                                   "expected_offset + sparse->size <= offset + bytes_read",
                                   (void *)0x0);
          if (wVar4 != L'\0') {
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                             ,L'ƒ',(uint)(_v1 == (void *)((v1 - offset) + (long)buff)),
                             "start == (const char *)buff + (size_t)(expected_offset - offset)",
                             (void *)0x0);
            sVar9 = (long)pvVar8 - (long)_v1;
            wVar4 = L'Ɠ';
            pcVar12 = "\' \'";
            cVar11 = ' ';
            goto LAB_001c55ea;
          }
LAB_001c55f3:
          v1 = v1 + sparse->size;
          sparse = sparse + 1;
          bVar3 = true;
          _v1 = pvVar8;
        }
        else {
          if (sparse->type == HOLE) {
            if ((void *)((long)buff + bytes_read) < pvVar8) {
              pvVar8 = (void *)((long)buff + bytes_read);
            }
            sVar9 = (long)pvVar8 - (long)_v1;
            wVar4 = L'ƈ';
            pcVar12 = "\'\\0\'";
            cVar11 = '\0';
LAB_001c55ea:
            assertion_memory_filled_with
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                       ,wVar4,_v1,"start",sVar9,"end - start",cVar11,pcVar12,(void *)0x0);
            goto LAB_001c55f3;
          }
          bVar3 = false;
        }
      } while (bVar3);
      sVar9 = bytes_read;
      pvVar8 = buff;
      if (v1 < (long)(offset + bytes_read)) {
        if (sparse->type == HOLE) {
          wVar4 = L'ƣ';
          pcVar12 = "\'\\0\'";
          cVar11 = '\0';
        }
        else {
          wVar4 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                                   ,L'Ƥ',(uint)(sparse->type == DATA),"sparse->type == DATA",
                                   (void *)0x0);
          if (wVar4 == L'\0') goto LAB_001c56bc;
          wVar4 = L'ƥ';
          pcVar12 = "\' \'";
          cVar11 = ' ';
        }
        assertion_memory_filled_with
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,wVar4,_v1,"start",(long)pvVar8 + (sVar9 - (long)_v1),"end - start",cVar11,
                   pcVar12,(void *)0x0);
      }
LAB_001c56bc:
      lVar10 = bytes_read + offset;
      iVar5 = archive_read_data_block(local_50,&buff,&bytes_read,&offset);
    } while (iVar5 == 0);
  }
  else {
    local_74 = 0;
    v1 = 0;
  }
  paVar6 = local_40;
  lVar7 = archive_entry_size(local_40);
  aVar2 = sparse->type;
  while (aVar2 == HOLE) {
    v1 = v1 + sparse->size;
    aVar2 = sparse[1].type;
    sparse = sparse + 1;
  }
  iVar5 = local_74 + (uint)(lVar10 < lVar7);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'ƴ',(uint)(aVar2 == END),"sparse->type == END",(void *)0x0);
  lVar7 = archive_entry_size(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'Ƶ',v1,"expected_offset",lVar7,"archive_entry_size(ae)",(void *)0x0);
  failure("%s",local_48);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'Ƹ',(long)iVar5,"holes_seen",(ulong)local_54,"expected_holes",(void *)0x0);
  extra = local_50;
  iVar5 = archive_read_close(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'ƺ',0,"ARCHIVE_OK",(long)iVar5,"archive_read_close(a)",extra);
  archive_entry_free(paVar6);
  return;
}

Assistant:

static void
verify_sparse_file(struct archive *a, const char *path,
    const struct sparse *sparse, int expected_holes)
{
	struct archive_entry *ae;
	const void *buff;
	size_t bytes_read;
	int64_t offset, expected_offset, last_offset;
	int holes_seen = 0;

	create_sparse_file(path, sparse);
	assert((ae = archive_entry_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, path));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));

	expected_offset = 0;
	last_offset = 0;
	while (ARCHIVE_OK == archive_read_data_block(a, &buff, &bytes_read,
	    &offset)) {
		const char *start = buff;
#if DEBUG
		fprintf(stderr, "%s: bytes_read=%d offset=%d\n", path, (int)bytes_read, (int)offset);
#endif
		if (offset > last_offset) {
			++holes_seen;
		}
		/* Blocks entirely before the data we just read. */
		while (expected_offset + (int64_t)sparse->size < offset) {
#if DEBUG
			fprintf(stderr, "    skipping expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif
			/* Must be holes. */
			assert(sparse->type == HOLE);
			expected_offset += sparse->size;
			++sparse;
		}
		/* Block that overlaps beginning of data */
		if (expected_offset < offset
		    && expected_offset + (int64_t)sparse->size <= offset + (int64_t)bytes_read) {
			const char *end = (const char *)buff + (expected_offset - offset) + (size_t)sparse->size;
#if DEBUG
			fprintf(stderr, "    overlapping hole expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif
			if (sparse->type == HOLE) {
				assertMemoryFilledWith(start, end - start, '\0');
			} else if (assert(sparse->type == DATA)) {
				assertMemoryFilledWith(start, end - start, ' ');
			}
			start = end;
			expected_offset += sparse->size;
			++sparse;
		}
		/* Blocks completely contained in data we just read. */
		while (expected_offset + (int64_t)sparse->size <= offset + (int64_t)bytes_read) {
			const char *end = (const char *)buff + (expected_offset - offset) + (size_t)sparse->size;
			if (sparse->type == HOLE) {
#if DEBUG
				fprintf(stderr, "    contained hole expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif

				/* verify data corresponding to hole is '\0' */
				if (end > (const char *)buff + bytes_read) {
					end = (const char *)buff + bytes_read;
				}
				assertMemoryFilledWith(start, end - start, '\0');
				start = end;
				expected_offset += sparse->size;
				++sparse;
			} else if (sparse->type == DATA) {
#if DEBUG
				fprintf(stderr, "    contained data expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif
				/* verify data corresponding to hole is ' ' */
				if (assert(expected_offset + sparse->size <= offset + bytes_read)) {
					assert(start == (const char *)buff + (size_t)(expected_offset - offset));
					assertMemoryFilledWith(start, end - start, ' ');
				}
				start = end;
				expected_offset += sparse->size;
				++sparse;
			} else {
				break;
			}
		}
		/* Block that overlaps end of data */
		if (expected_offset < offset + (int64_t)bytes_read) {
			const char *end = (const char *)buff + bytes_read;
#if DEBUG
			fprintf(stderr, "    trailing overlap expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif
			if (sparse->type == HOLE) {
				assertMemoryFilledWith(start, end - start, '\0');
			} else if (assert(sparse->type == DATA)) {
				assertMemoryFilledWith(start, end - start, ' ');
			}
		}
		last_offset = offset + bytes_read;
	}
	/* Count a hole at EOF? */
	if (last_offset < archive_entry_size(ae)) {
		++holes_seen;
	}

	/* Verify blocks after last read */
	while (sparse->type == HOLE) {
		expected_offset += sparse->size;
		++sparse;
	}
	assert(sparse->type == END);
	assertEqualInt(expected_offset, archive_entry_size(ae));

	failure("%s", path);
	assertEqualInt(holes_seen, expected_holes);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	archive_entry_free(ae);
}